

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varchar_data.hpp
# Opt level: O2

void duckdb::ArrowVarcharData<duckdb::hugeint_t,_duckdb::ArrowUUIDConverter,_int>::
     AppendTemplated<true>
               (ArrowAppendData *append_data,Vector *input,idx_t from,idx_t to,idx_t input_size)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  ArrowBuffer *this;
  ArrowBuffer *buffer;
  ArrowBuffer *this_00;
  ulong uVar3;
  unsigned_long *buf;
  idx_t i;
  int iVar4;
  idx_t iVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  hugeint_t input_00;
  UnifiedVectorFormat format;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&format);
  Vector::ToUnifiedFormat(input,input_size,&format);
  this = ArrowAppendData::GetMainBuffer(append_data);
  buffer = ArrowAppendData::GetValidityBuffer(append_data);
  this_00 = ArrowAppendData::GetAuxBuffer(append_data);
  lVar6 = to - from;
  ResizeValidity(buffer,append_data->row_count + lVar6);
  pdVar1 = buffer->dataptr;
  ArrowBuffer::resize(this,this->count + lVar6 * 4 + 4);
  pdVar2 = this->dataptr;
  iVar5 = append_data->row_count;
  if (iVar5 == 0) {
    pdVar2[0] = '\0';
    pdVar2[1] = '\0';
    pdVar2[2] = '\0';
    pdVar2[3] = '\0';
  }
  iVar5 = (idx_t)*(uint *)(pdVar2 + iVar5 * 4);
  lVar8 = 0;
  for (; from < to; from = from + 1) {
    uVar7 = from;
    if ((format.sel)->sel_vector != (sel_t *)0x0) {
      uVar7 = (ulong)(format.sel)->sel_vector[from];
    }
    uVar3 = append_data->row_count + lVar8;
    iVar4 = (int)iVar5;
    buf = format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0) ||
       (buf = (unsigned_long *)
              format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar7 >> 6],
       ((ulong)buf >> (uVar7 & 0x3f) & 1) != 0)) {
      iVar5 = (long)iVar4 + 0x24;
      *(int *)(pdVar2 + (uVar3 + 1) * 4) = (int)iVar5;
      ArrowBuffer::resize(this_00,iVar5);
      input_00.upper = (int64_t)(this_00->dataptr + iVar4);
      input_00.lower = *(uint64_t *)(format.data + uVar7 * 0x10 + 8);
      BaseUUID::ToString(*(BaseUUID **)(format.data + uVar7 * 0x10),input_00,(char *)buf);
    }
    else {
      pdVar1[uVar3 >> 3] = pdVar1[uVar3 >> 3] & ~(byte)(1L << ((byte)uVar3 & 7));
      append_data->null_count = append_data->null_count + 1;
      *(int *)(pdVar2 + (uVar3 + 1) * 4) = iVar4;
    }
    lVar8 = lVar8 + 1;
  }
  append_data->row_count = append_data->row_count + lVar6;
  UnifiedVectorFormat::~UnifiedVectorFormat(&format);
  return;
}

Assistant:

static void AppendTemplated(ArrowAppendData &append_data, Vector &input, idx_t from, idx_t to, idx_t input_size) {
		idx_t size = to - from;
		UnifiedVectorFormat format;
		input.ToUnifiedFormat(input_size, format);
		auto &main_buffer = append_data.GetMainBuffer();
		auto &validity_buffer = append_data.GetValidityBuffer();
		auto &aux_buffer = append_data.GetAuxBuffer();

		// resize the validity mask and set up the validity buffer for iteration
		ResizeValidity(validity_buffer, append_data.row_count + size);
		auto validity_data = (uint8_t *)validity_buffer.data();

		// resize the offset buffer - the offset buffer holds the offsets into the child array
		main_buffer.resize(main_buffer.size() + sizeof(BUFTYPE) * (size + 1));
		auto data = UnifiedVectorFormat::GetData<SRC>(format);
		auto offset_data = main_buffer.GetData<BUFTYPE>();
		if (append_data.row_count == 0) {
			// first entry
			offset_data[0] = 0;
		}
		// now append the string data to the auxiliary buffer
		// the auxiliary buffer's length depends on the string lengths, so we resize as required
		auto last_offset = offset_data[append_data.row_count];
		for (idx_t i = from; i < to; i++) {
			auto source_idx = format.sel->get_index(i);
			auto offset_idx = append_data.row_count + i + 1 - from;

			if (!format.validity.RowIsValid(source_idx)) {
				uint8_t current_bit;
				idx_t current_byte;
				GetBitPosition(append_data.row_count + i - from, current_byte, current_bit);
				SetNull(append_data, validity_data, current_byte, current_bit);
				offset_data[offset_idx] = last_offset;
				continue;
			}

			auto string_length = OP::GetLength(data[source_idx]);

			// append the offset data
			auto current_offset = UnsafeNumericCast<idx_t>(last_offset) + string_length;
			if (!LARGE_STRING &&
			    UnsafeNumericCast<idx_t>(last_offset) + string_length > NumericLimits<int32_t>::Maximum()) {
				D_ASSERT(append_data.options.arrow_offset_size == ArrowOffsetSize::REGULAR);
				throw InvalidInputException(
				    "Arrow Appender: The maximum total string size for regular string buffers is "
				    "%u but the offset of %lu exceeds this.\n* SET arrow_large_buffer_size=true to use large string "
				    "buffers",
				    NumericLimits<int32_t>::Maximum(), current_offset);
			}
			offset_data[offset_idx] = UnsafeNumericCast<BUFTYPE>(current_offset);

			// resize the string buffer if required, and write the string data
			aux_buffer.resize(current_offset);
			OP::WriteData(aux_buffer.data() + last_offset, data[source_idx]);

			last_offset = UnsafeNumericCast<BUFTYPE>(current_offset);
		}
		append_data.row_count += size;
	}